

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O2

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::BVHAggregate::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,BVHAggregate *this,Ray *ray,
          Float tMax)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  bool bVar5;
  ushort uVar6;
  LinearBVHNode *pLVar7;
  ShapeIntersection *pSVar8;
  int iVar9;
  long lVar10;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  int nodesToVisit [64];
  optional<pbrt::ShapeIntersection> primSi;
  Float local_270;
  uint local_26c;
  undefined8 local_258;
  uint local_250;
  Tuple3<pbrt::Vector3,_float> local_248;
  int iStack_23c;
  anon_union_4_2_72e6e63f_for_LinearBVHNode_1 aaStack_238 [64];
  optional<pbrt::ShapeIntersection> local_138;
  
  pLVar7 = this->nodes;
  if (pLVar7 == (LinearBVHNode *)0x0) {
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    auVar12 = ZEXT1264(ZEXT812(0));
    *(undefined1 (*) [64])((long)&__return_storage_ptr__->optionalValue + 0xc0) = auVar12;
    *(undefined1 (*) [64])((long)&__return_storage_ptr__->optionalValue + 0x80) = auVar12;
    *(undefined1 (*) [64])((long)&__return_storage_ptr__->optionalValue + 0x40) = auVar12;
    *(undefined1 (*) [64])&__return_storage_ptr__->optionalValue = auVar12;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->set = false;
  auVar13._8_4_ = 0x3f800000;
  auVar13._0_8_ = 0x3f8000003f800000;
  auVar13._12_4_ = 0x3f800000;
  iVar4 = 0;
  local_26c = 0;
  uVar1 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar2 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar11._4_4_ = uVar2;
  auVar11._0_4_ = uVar1;
  auVar11._8_8_ = 0;
  local_248.z = 1.0 / (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar11 = vdivps_avx(auVar13,auVar11);
  local_248._0_8_ = vmovlps_avx(auVar11);
  auVar11 = vcmpps_avx(auVar11,ZEXT816(0),1);
  auVar3._8_4_ = 1;
  auVar3._0_8_ = 0x100000001;
  auVar3._12_4_ = 1;
  auVar11 = vandps_avx512vl(auVar11,auVar3);
  local_258 = vmovlps_avx(auVar11);
  iVar9 = 0;
  local_250 = (uint)(local_248.z < 0.0);
  local_270 = tMax;
  do {
    pLVar7 = pLVar7 + iVar9;
    bVar5 = Bounds3<float>::IntersectP
                      (&pLVar7->bounds,&ray->o,&ray->d,local_270,(Vector3f *)&local_248,
                       (int *)&local_258);
    local_26c = local_26c + 1;
    if (bVar5) {
      uVar6 = pLVar7->nPrimitives;
      if (uVar6 != 0) {
        for (lVar10 = 0; (uint)lVar10 < (uint)uVar6; lVar10 = lVar10 + 1) {
          PrimitiveHandle::Intersect
                    (&local_138,
                     (this->primitives).
                     super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     (pLVar7->field_1).primitivesOffset + lVar10,ray,local_270);
          if (local_138.set == true) {
            pstd::optional<pbrt::ShapeIntersection>::operator=(__return_storage_ptr__,&local_138);
            pSVar8 = pstd::optional<pbrt::ShapeIntersection>::value(__return_storage_ptr__);
            local_270 = pSVar8->tHit;
          }
          pstd::optional<pbrt::ShapeIntersection>::~optional(&local_138);
          uVar6 = pLVar7->nPrimitives;
        }
        if (iVar4 != 0) goto LAB_003b5b79;
LAB_003b5bcf:
        *(long *)(in_FS_OFFSET + -0x310) = *(long *)(in_FS_OFFSET + -0x310) + (ulong)local_26c;
        return __return_storage_ptr__;
      }
      if (*(int *)((long)&local_258 + (ulong)pLVar7->axis * 4) == 0) {
        iVar9 = iVar9 + 1;
        aaStack_238[iVar4] = pLVar7->field_1;
        iVar4 = iVar4 + 1;
      }
      else {
        aaStack_238[iVar4].primitivesOffset = iVar9 + 1;
        iVar9 = (pLVar7->field_1).primitivesOffset;
        iVar4 = iVar4 + 1;
      }
    }
    else {
      if (iVar4 == 0) goto LAB_003b5bcf;
LAB_003b5b79:
      iVar9 = (&iStack_23c)[iVar4];
      iVar4 = iVar4 + -1;
    }
    pLVar7 = this->nodes;
  } while( true );
}

Assistant:

pstd::optional<ShapeIntersection> BVHAggregate::Intersect(const Ray &ray,
                                                          Float tMax) const {
    if (nodes == nullptr)
        return {};
    pstd::optional<ShapeIntersection> si;
    Vector3f invDir(1 / ray.d.x, 1 / ray.d.y, 1 / ray.d.z);
    int dirIsNeg[3] = {int(invDir.x < 0), int(invDir.y < 0), int(invDir.z < 0)};
    // Follow ray through BVH nodes to find primitive intersections
    int toVisitOffset = 0, currentNodeIndex = 0;
    int nodesToVisit[64];
    int nodesVisited = 0;
    while (true) {
        ++nodesVisited;
        const LinearBVHNode *node = &nodes[currentNodeIndex];
        // Check ray against BVH node
        if (node->bounds.IntersectP(ray.o, ray.d, tMax, invDir, dirIsNeg)) {
            if (node->nPrimitives > 0) {
                // Intersect ray with primitives in leaf BVH node
                for (int i = 0; i < node->nPrimitives; ++i) {
                    // Check for intersection with primitive in BVH node
                    pstd::optional<ShapeIntersection> primSi =
                        primitives[node->primitivesOffset + i].Intersect(ray, tMax);
                    if (primSi) {
                        si = primSi;
                        tMax = si->tHit;
                    }
                }
                if (toVisitOffset == 0)
                    break;
                currentNodeIndex = nodesToVisit[--toVisitOffset];

            } else {
                // Put far BVH node on _nodesToVisit_ stack, advance to near node
                if (dirIsNeg[node->axis]) {
                    nodesToVisit[toVisitOffset++] = currentNodeIndex + 1;
                    currentNodeIndex = node->secondChildOffset;
                } else {
                    nodesToVisit[toVisitOffset++] = node->secondChildOffset;
                    currentNodeIndex = currentNodeIndex + 1;
                }
            }
        } else {
            if (toVisitOffset == 0)
                break;
            currentNodeIndex = nodesToVisit[--toVisitOffset];
        }
    }

    bvhNodesVisited += nodesVisited;
    return si;
}